

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAS.cpp
# Opt level: O0

void __thiscall Storage::Tape::CAS::CAS(CAS *this,string *file_name)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  long *plVar4;
  reference pvVar5;
  const_reference pvVar6;
  uchar *puVar7;
  size_t __nbytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  uint *__nbytes_00;
  undefined1 local_210 [31];
  bool local_1f1 [9];
  long length_2;
  undefined1 local_1e0 [4];
  uint16_t next_line_address;
  uint16_t address;
  bool local_1c2;
  bool local_1c1 [9];
  int length_1;
  uint16_t end_address;
  uint16_t start_address;
  bool local_19a;
  bool local_199;
  undefined1 local_198 [29];
  bool local_17b [3];
  undefined1 local_178 [6];
  uint16_t length;
  bool local_15d;
  bool local_15c [4];
  undefined1 local_158 [5];
  bool is_ascii;
  bool is_basic;
  bool is_binary;
  vector<unsigned_char,_std::allocator<unsigned_char>_> type;
  size_t c;
  undefined1 local_130 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  long header_position;
  Mode parsing_mode_;
  undefined1 local_100 [8];
  FileHolder file;
  string *file_name_local;
  CAS *this_local;
  
  file.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)file_name;
  Tape::Tape(&this->super_Tape);
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_00cab238;
  std::vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>::vector
            (&this->chunks_);
  this->chunk_pointer_ = 0;
  this->phase_ = Header;
  this->distance_into_phase_ = 0;
  this->distance_into_bit_ = 0;
  FileHolder::FileHolder
            ((FileHolder *)local_100,
             (string *)file.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next,
             ReadWrite);
  header_position._0_4_ = 0;
  do {
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)FileHolder::tell((FileHolder *)local_100);
    FileHolder::read((FileHolder *)local_130,(int)local_100,(void *)0x8,(size_t)in_RCX);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    if (sVar3 == 8) {
      plVar4 = (long *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130
                                 );
      in_RCX = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x747d13ccbadea61f;
      if (*plVar4 == 0x747d13ccbadea61f) {
        FileHolder::read((FileHolder *)local_158,(int)local_100,(void *)0xa,0x747d13ccbadea61f);
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
        if (sVar3 == 10) {
          puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
          sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
          iVar2 = memcmp(puVar7,(anonymous_namespace)::binary_signature,sVar3);
          local_15c[3] = iVar2 == 0;
          puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
          sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
          iVar2 = memcmp(puVar7,(anonymous_namespace)::basic_signature,sVar3);
          local_15c[2] = iVar2 == 0;
          puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
          sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
          iVar2 = memcmp(puVar7,(anonymous_namespace)::ascii_signature,sVar3);
          local_15c[1] = iVar2 == 0;
          __nbytes_00 = &switchD_009ae7c8::switchdataD_00a736c4;
          switch((undefined4)header_position) {
          case 0:
            if (((local_15c[1]) || ((local_15c[3] & 1U) != 0)) || ((local_15c[2] & 1U) != 0)) {
              FileHolder::seek((FileHolder *)local_100,
                               (long)(signature.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 8),0);
              local_15c[0] = std::
                             vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                             ::empty(&this->chunks_);
              local_15c[0] = !local_15c[0];
              local_15d = true;
              FileHolder::read((FileHolder *)local_178,(int)local_100,(void *)0x10,
                               (size_t)__nbytes_00);
              in_RCX = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178;
              std::vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>::
              emplace_back<bool,bool,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>
                          *)&this->chunks_,local_15c,&local_15d,in_RCX);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
              if ((local_15c[1] & 1U) != 0) {
                header_position._0_4_ = 1;
              }
              if ((local_15c[3] & 1U) != 0) {
                header_position._0_4_ = 2;
              }
              if ((local_15c[2] & 1U) != 0) {
                header_position._0_4_ = 3;
              }
            }
            else {
              FileHolder::seek((FileHolder *)local_100,
                               (long)(signature.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 8),0);
              local_17b._1_2_ = FileHolder::get16le((FileHolder *)local_100);
              FileHolder::seek((FileHolder *)local_100,
                               (long)(signature.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 8),0);
              local_17b[0] = false;
              local_198[0x1c] = '\0';
              FileHolder::read((FileHolder *)local_198,(int)local_100,
                               (void *)((ulong)(ushort)local_17b._1_2_ + 2),(size_t)__nbytes_00);
              in_RCX = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_198;
              std::vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>::
              emplace_back<bool,bool,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>
                          *)&this->chunks_,local_17b,(bool *)(local_198 + 0x1c),in_RCX);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_198);
            }
            break;
          case 1:
            if ((((local_15c[3] & 1U) != 0) || ((local_15c[2] & 1U) != 0)) || (local_15c[1])) {
              FileHolder::seek((FileHolder *)local_100,
                               (long)signature.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
              header_position._0_4_ = 0;
              in_RCX = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__nbytes_00;
            }
            else {
              FileHolder::seek((FileHolder *)local_100,
                               (long)(signature.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 8),0);
              local_199 = false;
              local_19a = false;
              FileHolder::read((FileHolder *)&length_1,(int)local_100,(void *)0x100,
                               (size_t)__nbytes_00);
              in_RCX = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length_1;
              std::vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>::
              emplace_back<bool,bool,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>
                          *)&this->chunks_,&local_199,&local_19a,in_RCX);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&length_1);
            }
            break;
          case 2:
            FileHolder::seek((FileHolder *)local_100,
                             (long)(signature.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 8),0);
            local_1c1._7_2_ = FileHolder::get16le((FileHolder *)local_100);
            local_1c1._5_2_ = FileHolder::get16le((FileHolder *)local_100);
            FileHolder::seek((FileHolder *)local_100,
                             (long)(signature.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 8),0);
            local_1c1._1_4_ = ((uint)(ushort)local_1c1._5_2_ - (uint)(ushort)local_1c1._7_2_) + 1;
            local_1c1[0] = false;
            local_1c2 = false;
            FileHolder::read((FileHolder *)local_1e0,(int)local_100,
                             (void *)((long)(int)local_1c1._1_4_ + 6),(ulong)(uint)local_1c1._1_4_);
            in_RCX = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0;
            std::vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>::
            emplace_back<bool,bool,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>
                        *)&this->chunks_,local_1c1,&local_1c2,in_RCX);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
            header_position._0_4_ = 0;
            break;
          case 3:
            FileHolder::seek((FileHolder *)local_100,
                             (long)(signature.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 8),0);
            length_2._6_2_ = 0x8001;
            while ((length_2._4_2_ = FileHolder::get16le((FileHolder *)local_100),
                   length_2._4_2_ != 0 && (bVar1 = FileHolder::eof((FileHolder *)local_100), !bVar1)
                   )) {
              FileHolder::seek((FileHolder *)local_100,
                               (long)(int)(((uint)length_2._4_2_ - (uint)length_2._6_2_) + -2),1);
              length_2._6_2_ = length_2._4_2_;
            }
            __nbytes = FileHolder::tell((FileHolder *)local_100);
            local_1f1._1_8_ =
                 (~(ulong)signature.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - 8) + __nbytes;
            FileHolder::seek((FileHolder *)local_100,
                             (long)(signature.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 8),0);
            local_1f1[0] = false;
            local_210[0x1e] = '\0';
            FileHolder::read((FileHolder *)local_210,(int)local_100,(void *)local_1f1._1_8_,__nbytes
                            );
            in_RCX = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_210;
            std::vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>::
            emplace_back<bool,bool,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<Storage::Tape::CAS::Chunk,std::allocator<Storage::Tape::CAS::Chunk>>
                        *)&this->chunks_,local_1f1,(bool *)(local_210 + 0x1e),in_RCX);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_210);
            header_position._0_4_ = 0;
          }
          c._4_4_ = 0;
        }
        else {
          c._4_4_ = 3;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
      }
      else {
        bVar1 = std::vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>::
                empty(&this->chunks_);
        if (!bVar1) {
          pvVar5 = std::
                   vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>::
                   back(&this->chunks_);
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&pvVar5->data,pvVar6);
        }
        for (type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
            type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < (pointer)0x8;
            type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1) {
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,
                              (size_type)
                              type.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (*pvVar6 == '\x1f') {
            FileHolder::seek((FileHolder *)local_100,
                             (long)(signature.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                   (long)type.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage),0);
            break;
          }
          bVar1 = std::vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                  ::empty(&this->chunks_);
          if (!bVar1) {
            pvVar5 = std::
                     vector<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>::
                     back(&this->chunks_);
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,
                                (size_type)
                                type.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      (&pvVar5->data,pvVar6);
          }
        }
        c._4_4_ = 2;
      }
    }
    else {
      c._4_4_ = 3;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    if ((c._4_4_ != 0) && (c._4_4_ != 2)) {
      FileHolder::~FileHolder((FileHolder *)local_100);
      return;
    }
  } while( true );
}

Assistant:

CAS::CAS(const std::string &file_name) {
	Storage::FileHolder file(file_name);

	enum class Mode {
		Seeking,
		ASCII,
		Binary,
		BASIC
	} parsing_mode_ = Mode::Seeking;

	while(true) {
		// Churn through the file until the next header signature is found.
		const auto header_position = file.tell();
		const auto signature = file.read(8);
		if(signature.size() != 8) break;
		if(std::memcmp(signature.data(), header_signature, 8)) {
			if(!chunks_.empty()) chunks_.back().data.push_back(signature[0]);

			// Check for other 1fs in this stream, and repeat from there if any.
			for(size_t c = 1; c < 8; ++c) {
				if(signature[c] == 0x1f) {
					file.seek(header_position + long(c), SEEK_SET);
					break;
				} else {
					// Attach any unexpected bytes to the back of the most recent chunk.
					// In effect this creates a linear search for the next explicit tone.
					if(!chunks_.empty()) {
						chunks_.back().data.push_back(signature[c]);
					}
				}
			}
			continue;
		}

		// A header has definitely been found. Require from here at least 16 further bytes,
		// being the type and a name.
		const auto type = file.read(10);
		if(type.size() != 10) break;

		const bool is_binary	= !std::memcmp(type.data(), binary_signature, type.size());
		const bool is_basic		= !std::memcmp(type.data(), basic_signature, type.size());
		const bool is_ascii		= !std::memcmp(type.data(), ascii_signature, type.size());

		switch(parsing_mode_) {
			case Mode::Seeking: {
				if(is_ascii || is_binary || is_basic) {
					file.seek(header_position + 8, SEEK_SET);
					chunks_.emplace_back(!chunks_.empty(), true, file.read(10 + 6));

					if(is_ascii)	parsing_mode_ = Mode::ASCII;
					if(is_binary)	parsing_mode_ = Mode::Binary;
					if(is_basic)	parsing_mode_ = Mode::BASIC;
				} else {
					// Raw data appears now. Grab its length and keep going.
					file.seek(header_position + 8, SEEK_SET);
					const uint16_t length = file.get16le();

					file.seek(header_position + 8, SEEK_SET);
					chunks_.emplace_back(false, false, file.read(size_t(length) + 2));
				}
			} break;

			case Mode::ASCII:
				// Keep reading ASCII in 256-byte segments until a non-ASCII chunk arrives.
				if(is_binary || is_basic || is_ascii) {
					file.seek(header_position, SEEK_SET);
					parsing_mode_ = Mode::Seeking;
				} else {
					file.seek(header_position + 8, SEEK_SET);
					chunks_.emplace_back(false, false, file.read(256));
				}
			break;

			case Mode::Binary: {
				// Get the start and end addresses in order to figure out how much data
				// is here.
				file.seek(header_position + 8, SEEK_SET);
				const uint16_t start_address = file.get16le();
				const uint16_t end_address = file.get16le();

				file.seek(header_position + 8, SEEK_SET);
				const auto length = end_address - start_address + 1;
				chunks_.emplace_back(false, false, file.read(size_t(length) + 6));

				parsing_mode_ = Mode::Seeking;
			} break;

			case Mode::BASIC: {
				// Horror of horrors, this will mean actually following the BASIC
				// linked list of line contents.
				file.seek(header_position + 8, SEEK_SET);
				uint16_t address = 0x8001;	// the BASIC start address.
				while(true) {
					const uint16_t next_line_address = file.get16le();
					if(!next_line_address || file.eof()) break;
					file.seek(next_line_address - address - 2, SEEK_CUR);
					address = next_line_address;
				}
				const auto length = (file.tell() - 1) - (header_position + 8);

				// Create the chunk and return to regular parsing.
				file.seek(header_position + 8, SEEK_SET);
				chunks_.emplace_back(false, false, file.read(size_t(length)));
				parsing_mode_ = Mode::Seeking;
			} break;
		}
	}
}